

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

z_size_t gz_write(gz_statep state,voidpc buf,z_size_t len)

{
  int iVar1;
  uint uVar2;
  uint local_3c;
  uint local_38;
  uint n;
  uint copy;
  uint have;
  z_size_t put;
  z_size_t len_local;
  voidpc buf_local;
  gz_statep state_local;
  
  if (len == 0) {
    state_local = (gz_statep)0x0;
  }
  else if ((state->size == 0) && (iVar1 = gz_init(state), iVar1 == -1)) {
    state_local = (gz_statep)0x0;
  }
  else {
    if (state->seek != 0) {
      state->seek = 0;
      iVar1 = gz_zero(state,state->skip);
      if (iVar1 == -1) {
        return 0;
      }
    }
    put = len;
    len_local = (z_size_t)buf;
    state_local = (gz_statep)len;
    if (len < state->size) {
      do {
        if ((state->strm).avail_in == 0) {
          (state->strm).next_in = state->in;
        }
        uVar2 = ((int)(state->strm).next_in + (state->strm).avail_in) - (int)state->in;
        local_38 = state->size - uVar2;
        if (put < local_38) {
          local_38 = (uint)put;
        }
        memcpy(state->in + uVar2,(void *)len_local,(ulong)local_38);
        (state->strm).avail_in = local_38 + (state->strm).avail_in;
        (state->x).pos = (ulong)local_38 + (state->x).pos;
        len_local = len_local + local_38;
        put = put - local_38;
        if ((put != 0) && (iVar1 = gz_comp(state,0), iVar1 == -1)) {
          return 0;
        }
      } while (put != 0);
    }
    else if (((state->strm).avail_in == 0) || (iVar1 = gz_comp(state,0), iVar1 != -1)) {
      (state->strm).next_in = (Bytef *)buf;
      do {
        local_3c = 0xffffffff;
        if (put < 0xffffffff) {
          local_3c = (uint)put;
        }
        (state->strm).avail_in = local_3c;
        (state->x).pos = (ulong)local_3c + (state->x).pos;
        iVar1 = gz_comp(state,0);
        if (iVar1 == -1) {
          return 0;
        }
        put = put - local_3c;
      } while (put != 0);
    }
    else {
      state_local = (gz_statep)0x0;
    }
  }
  return (z_size_t)state_local;
}

Assistant:

local z_size_t gz_write(state, buf, len)
    gz_statep state;
    voidpc buf;
    z_size_t len;
{
    z_size_t put = len;

    /* if len is zero, avoid unnecessary operations */
    if (len == 0)
        return 0;

    /* allocate memory if this is the first time through */
    if (state->size == 0 && gz_init(state) == -1)
        return 0;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return 0;
    }

    /* for small len, copy to input buffer, otherwise compress directly */
    if (len < state->size) {
        /* copy to input buffer, compress when full */
        do {
            unsigned have, copy;

            if (state->strm.avail_in == 0)
                state->strm.next_in = state->in;
            have = (unsigned)((state->strm.next_in + state->strm.avail_in) -
                              state->in);
            copy = state->size - have;
            if (copy > len)
                copy = len;
            memcpy(state->in + have, buf, copy);
            state->strm.avail_in += copy;
            state->x.pos += copy;
            buf = (const char *)buf + copy;
            len -= copy;
            if (len && gz_comp(state, Z_NO_FLUSH) == -1)
                return 0;
        } while (len);
    }
    else {
        /* consume whatever's left in the input buffer */
        if (state->strm.avail_in && gz_comp(state, Z_NO_FLUSH) == -1)
            return 0;

        /* directly compress user buffer to file */
        state->strm.next_in = (z_const Bytef *)buf;
        do {
            unsigned n = (unsigned)-1;
            if (n > len)
                n = len;
            state->strm.avail_in = n;
            state->x.pos += n;
            if (gz_comp(state, Z_NO_FLUSH) == -1)
                return 0;
            len -= n;
        } while (len);
    }

    /* input was all buffered or compressed */
    return put;
}